

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_create.cpp
# Opt level: O0

unique_ptr<Image,_std::default_delete<Image>_> __thiscall
ktx::CommandCreate::scaleImage
          (CommandCreate *this,unique_ptr<Image,_std::default_delete<Image>_> *image,
          ktx_uint32_t width,ktx_uint32_t height)

{
  Boundary_Op BVar1;
  pointer pIVar2;
  optional<basisu::Resampler::Boundary_Op> *this_00;
  uint in_ECX;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *in_RDX
  ;
  __uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true> in_RDI;
  uint in_R8D;
  float fVar3;
  exception *e;
  unique_ptr<Image,_std::default_delete<Image>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff64;
  string local_48 [32];
  undefined1 local_28 [8];
  uint local_20;
  uint local_1c;
  
  local_20 = in_R8D;
  local_1c = in_ECX;
  pIVar2 = std::unique_ptr<Image,_std::default_delete<Image>_>::operator->
                     ((unique_ptr<Image,_std::default_delete<Image>_> *)0x1e09da);
  std::optional<std::__cxx11::string>::value_or<std::__cxx11::string&>
            (in_RDX,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  this_00 = (optional<basisu::Resampler::Boundary_Op> *)std::__cxx11::string::c_str();
  fVar3 = std::optional<float>::value_or<float&>
                    ((optional<float> *)this_00,
                     (float *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  BVar1 = std::optional<basisu::Resampler::Boundary_Op>::value_or<basisu::Resampler::Boundary_Op&>
                    (this_00,(Boundary_Op *)
                             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  (*pIVar2->_vptr_Image[0x11])
            (fVar3,local_28,pIVar2,(ulong)local_1c,(ulong)local_20,this_00,(ulong)BVar1);
  std::unique_ptr<Image,_std::default_delete<Image>_>::operator=
            ((unique_ptr<Image,_std::default_delete<Image>_> *)
             CONCAT44(BVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
  std::unique_ptr<Image,_std::default_delete<Image>_>::~unique_ptr
            ((unique_ptr<Image,_std::default_delete<Image>_> *)
             CONCAT44(BVar1,in_stack_ffffffffffffff50));
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<Image,_std::default_delete<Image>_>::unique_ptr
            ((unique_ptr<Image,_std::default_delete<Image>_> *)
             CONCAT44(BVar1,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48);
  return (__uniq_ptr_data<Image,_std::default_delete<Image>,_true,_true>)
         (tuple<Image_*,_std::default_delete<Image>_>)
         in_RDI.super___uniq_ptr_impl<Image,_std::default_delete<Image>_>._M_t.
         super__Tuple_impl<0UL,_Image_*,_std::default_delete<Image>_>.
         super__Head_base<0UL,_Image_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<Image>
CommandCreate::scaleImage(std::unique_ptr<Image> image, ktx_uint32_t width, ktx_uint32_t height)
{
    try {
        image = image->resample(width, height,
                options.mipmapFilter.value_or(options.defaultMipmapFilter).c_str(),
                options.mipmapFilterScale.value_or(options.defaultMipmapFilterScale),
                options.mipmapWrap.value_or(options.defaultMipmapWrap));
    } catch (const std::exception& e) {
        fatal(rc::RUNTIME_ERROR, "Image resampling failed: {}", e.what());
    }
    return image;
}